

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O1

void pztopology::TPZTriangle::ComputeHCurlDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions,
               TPZVec<int> *transformationIds)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int64_t iVar4;
  Fad<double> *pFVar5;
  long lVar6;
  Fad<double> *pFVar7;
  int *piVar8;
  TPZVec<int> *pTVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  TPZManVector<double,_3> edgeSign;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_1e8;
  Fad<double> *local_1d0;
  Fad<double> *local_1c8;
  undefined1 local_1c0 [8];
  Vector<double> local_1b8;
  Fad<double> *local_1a8;
  undefined1 local_1a0 [8];
  Vector<double> local_198;
  TPZVec<int> *local_188;
  long local_180;
  int64_t local_178;
  TPZManVector<double,_3> local_170;
  undefined1 local_138 [16];
  double *local_128;
  TPZManVector<Fad<double>,_3> local_b0;
  
  iVar4 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_188 = transformationIds;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,iVar4);
  TPZManVector<Fad<double>,_3>::TPZManVector((TPZManVector<Fad<double>,_3> *)(local_138 + 8),iVar4);
  local_178 = iVar4;
  if (0 < iVar4) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      pFVar7 = local_b0.super_TPZVec<Fad<double>_>.fStore;
      if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar5 = gradx->fElem;
      puVar1 = (undefined8 *)((long)&pFVar5->val_ + lVar12);
      puVar2 = (undefined8 *)((long)&(local_b0.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar12);
      *puVar2 = *puVar1;
      Vector<double>::operator=((Vector<double> *)(puVar2 + 1),(Vector<double> *)(puVar1 + 1));
      pdVar10 = local_128;
      *(undefined8 *)((long)&pFVar7->defaultVal + lVar12) =
           *(undefined8 *)((long)&pFVar5->defaultVal + lVar12);
      if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar7 = gradx->fElem;
      puVar1 = (undefined8 *)((long)&pFVar7[lVar6].val_ + lVar12);
      *(undefined8 *)((long)local_128 + lVar12) = *puVar1;
      Vector<double>::operator=
                ((Vector<double> *)((undefined8 *)((long)local_128 + lVar12) + 1),
                 (Vector<double> *)(puVar1 + 1));
      *(undefined8 *)((long)pdVar10 + lVar12 + 0x18) =
           *(undefined8 *)((long)&pFVar7[lVar6].defaultVal + lVar12);
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (local_178 != lVar11);
  }
  iVar4 = local_178;
  pTVar9 = local_188;
  iVar3 = local_188->fStore[3];
  local_1c0 = (undefined1  [8])0x0;
  TPZManVector<double,_3>::TPZManVector(&local_170,3,(double *)local_1c0);
  piVar8 = pTVar9->fStore;
  lVar11 = 0;
  do {
    local_170.super_TPZVec<double>.fStore[lVar11] = (double)(int)(-(uint)(piVar8[lVar11] != 0) | 1);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (0 < iVar4) {
    local_188 = (TPZVec<int> *)(double)(int)(-(*(byte *)(pTVar9->fStore + 3) & 1) | 1);
    local_180 = (long)(iVar3 * 2) * 0x10 + 0x15437f0;
    lVar12 = 8;
    lVar11 = 0;
    do {
      local_1e8.fadexpr_.left_ =
           (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1e8.fadexpr_.right_.constant_ = *local_170.super_TPZVec<double>.fStore;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0x3ff00000;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)((long)directions->fElem + lVar12 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1a0 = (undefined1  [8])((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_198._0_8_ = (long)local_128 + lVar12 + -8;
      local_1e8.fadexpr_.right_.constant_ = *local_170.super_TPZVec<double>.fStore;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0x3ff00000;
      local_1b8.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x20 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1a0 = (undefined1  [8])((long)local_128 + lVar12 + -8);
      local_198.num_elts = 0x667f3bcd;
      local_198._4_4_ = 0x3ff6a09e;
      local_198.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = local_170.super_TPZVec<double>.fStore[1];
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0x667f3bcd;
      local_1b8._4_4_ = 0x3ff6a09e;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x40 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1d0 = (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1a0 = (undefined1  [8])&local_1d0;
      local_198.num_elts = 0x667f3bcd;
      local_198._4_4_ = 0x3ff6a09e;
      local_198.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = local_170.super_TPZVec<double>.fStore[1];
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0x667f3bcd;
      local_1b8._4_4_ = 0x3ff6a09e;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x60 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1d0 = (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1c8 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_1a0 = (undefined1  [8])&local_1d0;
      local_198.num_elts = -1;
      local_198._4_4_ = 0;
      local_1e8.fadexpr_.right_.constant_ = local_170.super_TPZVec<double>.fStore[2];
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0x3ff00000;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x80 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1a0 = (undefined1  [8])((long)local_128 + lVar12 + -8);
      local_1e8.fadexpr_.right_.constant_ = local_170.super_TPZVec<double>.fStore[2];
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0x3ff00000;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0xa0 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1d0 = (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1a8 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0x3fe00000;
      local_1b8.ptr_to_data = (double *)0x0;
      local_198._0_8_ = *local_170.super_TPZVec<double>.fStore;
      local_1a0 = (undefined1  [8])&local_1d0;
      local_198.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = 1.0;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1c8 = (Fad<double> *)local_1c0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0xc0 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)&local_1e8);
      local_138._0_8_ = (long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8;
      local_1c8 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_1d0 = (Fad<double> *)local_138;
      local_1a0 = (undefined1  [8])&local_1d0;
      local_198.num_elts = 0x667f3bcd;
      local_198._4_4_ = 0x3fe6a09e;
      local_198.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = local_170.super_TPZVec<double>.fStore[1];
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1b8.num_elts = 0x667f3bcd;
      local_1b8._4_4_ = 0x3ff6a09e;
      local_1b8.ptr_to_data = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        local_1c0 = (undefined1  [8])&local_1e8;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      local_1c0 = (undefined1  [8])&local_1e8;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0xe0 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)local_1c0);
      local_1a8 = (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1b8.num_elts = 0;
      local_1b8._4_4_ = 0xbfe00000;
      local_1b8.ptr_to_data = (double *)0x0;
      local_1c8 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_198._0_8_ = local_170.super_TPZVec<double>.fStore[2];
      local_1a0 = (undefined1  [8])&local_1d0;
      local_198.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = 1.0;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1d0 = (Fad<double> *)local_1c0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x100 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)&local_1e8);
      local_1b8._0_8_ = *local_170.super_TPZVec<double>.fStore * (double)local_188;
      local_1a8 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_1b8.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = 0.5;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x120 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)&local_1e8);
      local_1b8._0_8_ = local_170.super_TPZVec<double>.fStore[1] * (double)local_188;
      local_1d0 = (Fad<double> *)((long)local_128 + lVar12 + -8);
      local_198._0_8_ = (long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8;
      local_1a0 = (undefined1  [8])&local_1d0;
      local_1b8.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = 0.5;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      local_1a8 = (Fad<double> *)local_1a0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x140 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                  *)&local_1e8);
      local_1b8._0_8_ = local_170.super_TPZVec<double>.fStore[2] * (double)local_188;
      local_1a8 = (Fad<double> *)((long)local_b0.super_TPZVec<Fad<double>_>.fStore + lVar12 + -8);
      local_1b8.ptr_to_data = (double *)0x0;
      local_1e8.fadexpr_.right_.constant_ = 0.5;
      local_1e8.fadexpr_.right_.defaultVal = 0.0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
        local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
      Fad<double>::operator=
                ((Fad<double> *)
                 ((long)directions->fElem +
                 lVar12 + (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                          0x160 + -8),
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)&local_1e8);
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar7 = directions->fElem;
      *(undefined8 *)((long)pFVar7 + lVar12 + -8 + lVar6 * 0x180) =
           *(undefined8 *)(local_180 + -0x10 + lVar11 * 8);
      if (*(int *)((long)&pFVar7[lVar6 * 0xc].val_ + lVar12) != 0) {
        local_1c0 = (undefined1  [8])0x0;
        Vector<double>::operator=
                  ((Vector<double> *)((long)&pFVar7[lVar6 * 0xc].val_ + lVar12),(double *)local_1c0)
        ;
      }
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xe)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar7 = directions->fElem;
      *(undefined8 *)((long)pFVar7 + lVar12 + -8 + lVar6 * 0x1a0) =
           *(undefined8 *)(local_180 + lVar11 * 8);
      if (*(int *)((long)&pFVar7[lVar6 * 0xd].val_ + lVar12) != 0) {
        local_1c0 = (undefined1  [8])0x0;
        Vector<double>::operator=
                  ((Vector<double> *)((long)&pFVar7[lVar6 * 0xd].val_ + lVar12),(double *)local_1c0)
        ;
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (local_178 != lVar11);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_170);
  TPZManVector<Fad<double>,_3>::~TPZManVector((TPZManVector<Fad<double>,_3> *)(local_138 + 8));
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }